

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O1

string * __thiscall
BusyIndicator::writeXml_abi_cxx11_(string *__return_storage_ptr__,BusyIndicator *this,int indent)

{
  char cVar1;
  ostream *poVar2;
  stringstream str;
  string local_210;
  char *local_1f0;
  long local_1e8;
  char local_1e0 [16];
  string local_1d0;
  stringstream local_1b0 [16];
  long local_1a0 [14];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Util::getIndent_abi_cxx11_(0);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,local_1f0,local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"<BusyIndicator",0xe);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"animating","");
  Util::writeXmlAttribute<bool>(&local_1d0,(stringstream *)local_1b0,&local_210,this->animating);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," />",3);
  cVar1 = (char)(ostream *)local_1a0;
  std::ios::widen((char)*(undefined8 *)(local_1a0[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string BusyIndicator::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<BusyIndicator";

	Util::writeXmlAttribute(str, "animating", animating);
	writeXmlAttributes(str);
	str << " />" << std::endl;
	return str.str();
}